

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O2

void __thiscall yactfr::internal::TsdlParser::_addPseudoDtRoles(TsdlParser *this)

{
  optional<yactfr::internal::PseudoTraceType> *this_00;
  PseudoDt *pPVar1;
  _Hash_node_base *p_Var2;
  pointer_type pPVar3;
  _Hash_node_base *p_Var4;
  __node_base *p_Var5;
  TsdlParser *this_01;
  allocator local_59;
  DefClkTsRoleAdder visitor;
  
  _setImplicitMappedClkTypeId(this);
  this_00 = &this->_pseudoTraceType;
  pPVar3 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(this_00);
  if ((pPVar3->_pseudoPktHeaderType)._M_t.
      super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
      ._M_t.
      super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
      .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl != (PseudoDt *)0x0) {
    pPVar3 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(this_00);
    pPVar1 = (pPVar3->_pseudoPktHeaderType)._M_t.
             super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
             ._M_t.
             super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
             .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&visitor,"magic",&local_59);
    _addPseudoFlUIntTypeRoles<false>(this,pPVar1,(string *)&visitor,PacketMagicNumber);
    std::__cxx11::string::~string((string *)&visitor);
    pPVar3 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(this_00);
    pPVar1 = (pPVar3->_pseudoPktHeaderType)._M_t.
             super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
             ._M_t.
             super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
             .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&visitor,"stream_id",&local_59);
    _addPseudoFlUIntTypeRoles<false>(this,pPVar1,(string *)&visitor,DataStreamTypeId);
    std::__cxx11::string::~string((string *)&visitor);
    pPVar3 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(this_00);
    pPVar1 = (pPVar3->_pseudoPktHeaderType)._M_t.
             super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
             ._M_t.
             super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
             .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&visitor,"stream_instance_id",&local_59);
    _addPseudoFlUIntTypeRoles<false>(this,pPVar1,(string *)&visitor,DataStreamId);
    std::__cxx11::string::~string((string *)&visitor);
    pPVar3 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(this_00);
    pPVar1 = (pPVar3->_pseudoPktHeaderType)._M_t.
             super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
             ._M_t.
             super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
             .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
    this_01 = (TsdlParser *)&visitor;
    std::__cxx11::string::string((string *)this_01,"uuid",&local_59);
    _setPseudoSlArrayTypeMetadataStreamUuidRole(this_01,pPVar1,(string *)&visitor);
    std::__cxx11::string::~string((string *)&visitor);
  }
  pPVar3 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(this_00);
  p_Var5 = &(pPVar3->_pseudoDsts)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    p_Var4 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
    pPVar1 = (PseudoDt *)p_Var4[0x11]._M_nxt;
    if (pPVar1 != (PseudoDt *)0x0) {
      std::__cxx11::string::string((string *)&visitor,"packet_size",&local_59);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar1,(string *)&visitor,PacketTotalLength);
      std::__cxx11::string::~string((string *)&visitor);
      pPVar1 = (PseudoDt *)
               (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor)
               [0x11]._M_nxt;
      std::__cxx11::string::string((string *)&visitor,"content_size",&local_59);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar1,(string *)&visitor,PacketContentLength);
      std::__cxx11::string::~string((string *)&visitor);
      pPVar1 = (PseudoDt *)
               (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor)
               [0x11]._M_nxt;
      std::__cxx11::string::string((string *)&visitor,"packet_size",&local_59);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar1,(string *)&visitor,PacketTotalLength);
      std::__cxx11::string::~string((string *)&visitor);
      pPVar1 = (PseudoDt *)
               (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor)
               [0x11]._M_nxt;
      std::__cxx11::string::string((string *)&visitor,"timestamp_end",&local_59);
      _addPseudoFlUIntTypeRoles<true>(this,pPVar1,(string *)&visitor,PacketEndDefaultClockTimestamp)
      ;
      std::__cxx11::string::~string((string *)&visitor);
      pPVar1 = (PseudoDt *)
               (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor)
               [0x11]._M_nxt;
      std::__cxx11::string::string((string *)&visitor,"events_discarded",&local_59);
      _addPseudoFlUIntTypeRoles<false>
                (this,pPVar1,(string *)&visitor,DiscardedEventRecordCounterSnapshot);
      std::__cxx11::string::~string((string *)&visitor);
      pPVar1 = (PseudoDt *)
               (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor)
               [0x11]._M_nxt;
      std::__cxx11::string::string((string *)&visitor,"packet_seq_num",&local_59);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar1,(string *)&visitor,PacketSequenceNumber);
      std::__cxx11::string::~string((string *)&visitor);
      p_Var4 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
    }
    pPVar1 = (PseudoDt *)p_Var4[0x12]._M_nxt;
    if (pPVar1 != (PseudoDt *)0x0) {
      std::__cxx11::string::string((string *)&visitor,"id",&local_59);
      _addPseudoFlUIntTypeRoles<false>(this,pPVar1,(string *)&visitor,EventRecordTypeId);
      std::__cxx11::string::~string((string *)&visitor);
    }
  }
  visitor.super_PseudoDtVisitor._vptr_PseudoDtVisitor =
       (PseudoDtVisitor)&PTR__PseudoDtVisitor_003622a0;
  pPVar3 = boost::optional<yactfr::internal::PseudoTraceType>::operator->(this_00);
  p_Var5 = &(pPVar3->_pseudoDsts)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    p_Var4 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
    p_Var2 = p_Var4[0x11]._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      (*(code *)p_Var2->_M_nxt[4]._M_nxt)(p_Var2,&visitor);
      p_Var4 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
    }
    p_Var4 = p_Var4[0x12]._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      (*(code *)p_Var4->_M_nxt[4]._M_nxt)(p_Var4,&visitor);
    }
  }
  return;
}

Assistant:

void TsdlParser::_addPseudoDtRoles()
{
    /*
     * First, set an implicit mapped clock type internal ID on specific
     * pseudo fixed-length unsigned integer types.
     *
     * For example, if the current pseudo trace type contains a single
     * clock type, then any pseudo fixed-length unsigned integer type
     * named `timestamp` within pseudo event record header types, which
     * are not already mapped to a clock type, are mapped to this single
     * clock type.
     */
    this->_setImplicitMappedClkTypeId();

    // add/set simple roles
    if (_pseudoTraceType->pseudoPktHeaderType()) {
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(), "magic",
                                        UnsignedIntegerTypeRole::PacketMagicNumber);
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(), "stream_id",
                                        UnsignedIntegerTypeRole::DataStreamTypeId);
        this->_addPseudoFlUIntTypeRoles(*_pseudoTraceType->pseudoPktHeaderType(),
                                        "stream_instance_id",
                                        UnsignedIntegerTypeRole::DataStreamId);
        this->_setPseudoSlArrayTypeMetadataStreamUuidRole(*_pseudoTraceType->pseudoPktHeaderType(),
                                                          "uuid");
    }

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        auto& pseudoDst = idPseudoDstPair.second;

        if (pseudoDst->pseudoPktCtxType()) {
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_size",
                                            UnsignedIntegerTypeRole::PacketTotalLength);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "content_size",
                                            UnsignedIntegerTypeRole::PacketContentLength);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_size",
                                            UnsignedIntegerTypeRole::PacketTotalLength);
            this->_addPseudoFlUIntTypeRoles<true>(*pseudoDst->pseudoPktCtxType(), "timestamp_end",
                                                  UnsignedIntegerTypeRole::PacketEndDefaultClockTimestamp);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "events_discarded",
                                            UnsignedIntegerTypeRole::DiscardedEventRecordCounterSnapshot);
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoPktCtxType(), "packet_seq_num",
                                            UnsignedIntegerTypeRole::PacketSequenceNumber);
        }

        if (pseudoDst->pseudoErHeaderType()) {
            this->_addPseudoFlUIntTypeRoles(*pseudoDst->pseudoErHeaderType(), "id",
                                            UnsignedIntegerTypeRole::EventRecordTypeId);
        }
    }

    // add "default clock timestamp" role
    DefClkTsRoleAdder visitor;

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        auto& pseudoDst = idPseudoDstPair.second;

        if (pseudoDst->pseudoPktCtxType()) {
            pseudoDst->pseudoPktCtxType()->accept(visitor);
        }

        if (pseudoDst->pseudoErHeaderType()) {
            pseudoDst->pseudoErHeaderType()->accept(visitor);
        }
    }
}